

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O3

void Dam_ManCreatePairs(Dam_Man_t *p,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  int *piVar2;
  size_t __size;
  bool bVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int v;
  int iVar10;
  Vec_Int_t *p_00;
  int *piVar11;
  Hash_IntMan_t *p_01;
  Vec_Int_t *p_02;
  Gia_Man_t *pGVar12;
  Hash_IntMan_t *pHVar13;
  Vec_Flt_t *pVVar14;
  float *pfVar15;
  Vec_Que_t *pVVar16;
  Vec_Int_t *pVVar17;
  void *__s;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  int iVar26;
  ulong uVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  double dVar31;
  Vec_Int_t *vRefsXor;
  Vec_Int_t *vRefsAnd;
  int *local_c0;
  int local_a8;
  int local_a4;
  Vec_Flt_t **local_80;
  long local_50;
  Vec_Int_t *local_48;
  ulong local_40;
  Vec_Int_t *local_38;
  
  Dam_ManCollectSets(p);
  pVVar17 = p->pGia->vSuper;
  iVar26 = p->pGia->nObjs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar26 - 1U) {
    iVar8 = iVar26;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar8;
  iVar5 = 0;
  if (iVar8 == 0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)malloc((long)iVar8 << 2);
  }
  p_00->pArray = piVar11;
  p_01 = Hash_IntManStart(iVar26 / 2);
  p_02 = (Vec_Int_t *)malloc(0x10);
  iVar26 = 1000;
  p_02->nCap = 1000;
  local_c0 = (int *)calloc(1,4000);
  p_02->pArray = local_c0;
  p_02->nSize = 1000;
  Dam_ManCreateMultiRefs(p,&local_38,&local_48);
  pVVar4 = local_48;
  pGVar12 = p->pGia;
  if (pGVar12->nObjs < 1) {
    local_50 = 1000;
    local_a8 = 0;
    iVar8 = 0;
    local_a4 = 0;
  }
  else {
    lVar23 = 0;
    local_a4 = 0;
    iVar8 = 0;
    local_a8 = 0;
    iVar5 = 0;
    do {
      if (pGVar12->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = pGVar12->pObjs + lVar23;
      if (((~*(uint *)pGVar1 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar1) &&
         (lVar23 < p->vNod2Set->nSize)) {
        uVar7 = p->vNod2Set->pArray[lVar23];
        uVar20 = (ulong)uVar7;
        if (uVar20 != 0) {
          if (((int)uVar7 < 0) || (p->vSetStore->nSize <= (int)uVar7)) goto LAB_006854ad;
          piVar11 = p->vSetStore->pArray;
          iVar6 = piVar11[uVar20];
          pVVar17->nSize = 0;
          uVar7 = (uint)*(undefined8 *)pGVar1;
          if (((int)uVar7 < 0) || ((uVar7 & 0x1fffffff) == 0x1fffffff)) {
LAB_00685548:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                          ,0x270,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
          }
          uVar18 = (uint)((ulong)*(undefined8 *)pGVar1 >> 0x20) & 0x1fffffff;
          if ((uVar7 & 0x1fffffff) < uVar18) {
            iVar24 = piVar11[uVar20];
            if (0 < iVar24) {
              lVar28 = 0;
              do {
                uVar7 = piVar11[uVar20 + lVar28 + 1];
                if ((int)uVar7 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                ,0xf2,"int Abc_Lit2Var(int)");
                }
                if (pVVar4->nSize <= (int)(uVar7 >> 1)) goto LAB_0068548e;
                if (1 < pVVar4->pArray[uVar7 >> 1]) {
                  Vec_IntPush(pVVar17,uVar7);
                  iVar24 = piVar11[uVar20];
                }
                lVar28 = lVar28 + 1;
              } while (lVar28 < iVar24);
            }
          }
          else {
            if (((uVar7 & 0x1fffffff) <= uVar18) ||
               ((pGVar12->pMuxes != (uint *)0x0 && (pGVar12->pMuxes[lVar23] != 0))))
            goto LAB_00685548;
            iVar24 = piVar11[uVar20];
            if (0 < iVar24) {
              lVar28 = 0;
              do {
                iVar10 = piVar11[uVar20 + lVar28 + 1];
                if (((long)iVar10 < 0) || (local_38->nSize <= iVar10)) goto LAB_0068548e;
                if (1 < local_38->pArray[iVar10]) {
                  Vec_IntPush(pVVar17,iVar10);
                  iVar24 = piVar11[uVar20];
                }
                lVar28 = lVar28 + 1;
              } while (lVar28 < iVar24);
            }
          }
          iVar5 = iVar5 + ((iVar6 + -1) * iVar6) / 2;
          iVar6 = pVVar17->nSize;
          if (1 < iVar6) {
            local_a8 = local_a8 + ((uint)((iVar6 + -1) * iVar6) >> 1);
            Vec_IntPush(p_00,-(int)lVar23);
            iVar6 = pVVar17->nSize;
            if (0 < iVar6) {
              lVar30 = 1;
              lVar28 = 0;
              do {
                lVar25 = lVar28 + 1;
                uVar20 = (ulong)iVar6;
                if (lVar25 < (long)uVar20) {
                  iVar24 = pVVar17->pArray[lVar28];
                  lVar28 = lVar30;
                  do {
                    iVar6 = pVVar17->pArray[lVar28];
                    bVar3 = iVar6 < iVar24;
                    uVar7 = (uint)*(undefined8 *)pGVar1;
                    iVar10 = iVar24;
                    if ((((~uVar7 & 0x1fffffff) != 0 && -1 < (int)uVar7) &&
                        (uVar7 & 0x1fffffff) <
                        ((uint)((ulong)*(undefined8 *)pGVar1 >> 0x20) & 0x1fffffff)) == bVar3) {
                      iVar10 = iVar6;
                      iVar6 = iVar24;
                    }
                    uVar7 = Hash_Int2ManInsert(p_01,iVar6,iVar10,
                                               (int)CONCAT71((int7)(uVar20 >> 8),bVar3));
                    if ((int)uVar7 < 0) goto LAB_006854ad;
                    uVar18 = uVar7 * 4;
                    uVar19 = p_01->vObjs->nSize;
                    if (uVar19 == uVar18 ||
                        SBORROW4(uVar19,uVar18) != (int)(uVar19 + uVar7 * -4) < 0)
                    goto LAB_006854ad;
                    piVar11 = p_01->vObjs->pArray;
                    iVar6 = piVar11[(ulong)uVar18 + 2];
                    piVar11[(ulong)uVar18 + 2] = iVar6 + 1;
                    if (iVar6 == 1) {
                      uVar18 = (uint)*(undefined8 *)pGVar1;
                      uVar19 = 0;
                      if ((~uVar18 & 0x1fffffff) != 0 && -1 < (int)uVar18) {
                        uVar19 = (uint)((uVar18 & 0x1fffffff) <
                                       ((uint)((ulong)*(undefined8 *)pGVar1 >> 0x20) & 0x1fffffff));
                      }
                      iVar8 = iVar8 + 1;
                      local_a4 = local_a4 + uVar19;
                    }
                    Vec_IntPush(p_00,uVar7);
                    if (iVar26 <= (int)uVar7) {
                      Vec_IntFillExtra(p_02,(iVar26 * 3) / 2,0);
                    }
                    if ((p->vNodLevR->nSize <= lVar23) ||
                       (iVar26 = p_02->nSize, iVar26 <= (int)uVar7)) goto LAB_0068548e;
                    iVar6 = p->vNodLevR->pArray[lVar23];
                    local_c0 = p_02->pArray;
                    uVar20 = (ulong)uVar7;
                    if (local_c0[uVar20] < iVar6) {
                      local_c0[uVar20] = iVar6;
                    }
                    lVar28 = lVar28 + 1;
                    iVar6 = pVVar17->nSize;
                  } while ((int)lVar28 < iVar6);
                  uVar20 = (ulong)iVar6;
                }
                lVar30 = lVar30 + 1;
                lVar28 = lVar25;
              } while (lVar25 < (long)uVar20);
            }
          }
        }
      }
      lVar23 = lVar23 + 1;
      pGVar12 = p->pGia;
    } while (lVar23 < pGVar12->nObjs);
    local_50 = (long)iVar26;
  }
  if (local_38->pArray != (int *)0x0) {
    free(local_38->pArray);
  }
  free(local_38);
  if (local_48->pArray != (int *)0x0) {
    free(local_48->pArray);
  }
  free(local_48);
  pHVar13 = Hash_IntManStart((iVar8 * 3) / 2);
  p->vHash = pHVar13;
  uVar18 = iVar8 * 2;
  pVVar14 = (Vec_Flt_t *)malloc(0x10);
  uVar7 = 0x10;
  uVar19 = uVar18;
  if (iVar8 * 2 - 1U < 0xf) {
    uVar19 = 0x10;
  }
  pVVar14->nCap = uVar19;
  lVar23 = (long)(int)uVar19;
  if (uVar19 == 0) {
    p->vCounts = pVVar14;
    pfVar15 = (float *)malloc(0x40);
    pVVar14->pArray = pfVar15;
    pVVar14->nCap = 0x10;
  }
  else {
    pfVar15 = (float *)malloc(lVar23 * 4);
    pVVar14->pArray = pfVar15;
    p->vCounts = pVVar14;
    uVar7 = uVar19;
  }
  local_80 = &p->vCounts;
  pVVar14->nSize = 1;
  *pfVar15 = 1e+09;
  pVVar16 = (Vec_Que_t *)calloc(1,0x20);
  if ((int)uVar7 < 0x11) {
    uVar7 = 0x10;
  }
  pVVar16->nSize = 1;
  pVVar16->nCap = uVar7 + 1;
  __size = (ulong)uVar7 * 4 + 4;
  piVar11 = (int *)malloc(__size);
  memset(piVar11,0xff,__size);
  pVVar16->pHeap = piVar11;
  piVar11 = (int *)malloc(__size);
  memset(piVar11,0xff,__size);
  pVVar16->pOrder = piVar11;
  p->vQue = pVVar16;
  pVVar16->pCostsFlt = &pVVar14->pArray;
  pVVar17 = (Vec_Int_t *)malloc(0x10);
  pVVar17->nSize = 0;
  pVVar17->nCap = uVar19;
  if (uVar19 == 0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)malloc(lVar23 * 4);
  }
  pVVar17->pArray = piVar11;
  p->vDiv2Nod = pVVar17;
  Vec_IntPush(pVVar17,1000000000);
  uVar7 = p->pGia->nObjs;
  pVVar17 = (Vec_Int_t *)malloc(0x10);
  uVar9 = 0x10;
  if (0xe < uVar7 - 1) {
    uVar9 = uVar7;
  }
  pVVar17->nSize = 0;
  pVVar17->nCap = uVar9;
  if (uVar9 == 0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)malloc((long)(int)uVar9 << 2);
  }
  pVVar17->pArray = piVar11;
  p->vNodStore = pVVar17;
  Vec_IntPush(pVVar17,-1);
  pVVar17 = p_01->vObjs;
  iVar26 = pVVar17->nSize;
  iVar6 = iVar26 + 3;
  if (-1 < iVar26) {
    iVar6 = iVar26;
  }
  uVar29 = iVar6 >> 2;
  uVar9 = uVar29 - 1;
  uVar7 = 0x10;
  if (0xe < uVar9) {
    uVar7 = uVar29;
  }
  uVar20 = 0;
  if (uVar7 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar7 << 2);
  }
  memset(__s,0xff,(long)(int)uVar29 << 2);
  iVar6 = 0;
  if (7 < iVar26) {
    uVar21 = 2;
    if (2 < (int)uVar29) {
      uVar21 = (ulong)uVar29;
    }
    iVar6 = 0;
    uVar27 = 1;
    uVar20 = 0;
    local_40 = uVar21;
    do {
      if ((long)pVVar17->nSize <= (long)(uVar27 * 4)) goto LAB_006854ad;
      piVar11 = pVVar17->pArray;
      iVar26 = piVar11[uVar27 * 4 + 2];
      if (1 < iVar26) {
        iVar24 = 0;
        if (piVar11[uVar27 * 4 + 1] < piVar11[uVar27 * 4]) {
          iVar24 = iVar26;
        }
        v = Hash_Int2ManInsert(p->vHash,piVar11[uVar27 * 4],piVar11[uVar27 * 4 + 1],(int)uVar21);
        iVar10 = p->vHash->vObjs->nSize;
        iVar22 = iVar10 + 3;
        if (-1 < iVar10) {
          iVar22 = iVar10;
        }
        if (v != (iVar22 >> 2) + -1) {
          __assert_fail("Num == Hash_IntManEntryNum(p->vHash)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                        ,0x29f,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
        }
        pVVar14 = *local_80;
        if (v != pVVar14->nSize) {
          __assert_fail("Num == Vec_FltSize(p->vCounts)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                        ,0x2a0,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
        }
        if ((long)pVVar17->nSize <= (long)(uVar27 * 4)) goto LAB_006854ad;
        if (local_50 <= (long)uVar27) goto LAB_0068548e;
        iVar10 = Dam_ManDivSlack(p,pVVar17->pArray[uVar27 * 4],pVVar17->pArray[uVar27 * 4 + 1],
                                 local_c0[uVar27]);
        uVar7 = pVVar14->nSize;
        if (uVar7 == pVVar14->nCap) {
          if ((int)uVar7 < 0x10) {
            if (pVVar14->pArray == (float *)0x0) {
              pfVar15 = (float *)malloc(0x40);
            }
            else {
              pfVar15 = (float *)realloc(pVVar14->pArray,0x40);
            }
            pVVar14->pArray = pfVar15;
            pVVar14->nCap = 0x10;
          }
          else {
            if (pVVar14->pArray == (float *)0x0) {
              pfVar15 = (float *)malloc((ulong)uVar7 * 8);
            }
            else {
              pfVar15 = (float *)realloc(pVVar14->pArray,(ulong)uVar7 * 8);
            }
            pVVar14->pArray = pfVar15;
            pVVar14->nCap = uVar7 * 2;
          }
        }
        else {
          pfVar15 = pVVar14->pArray;
        }
        iVar22 = pVVar14->nSize;
        pVVar14->nSize = iVar22 + 1;
        pfVar15[iVar22] = (float)iVar10 * 0.005 + (float)iVar26;
        Vec_QuePush(p->vQue,v);
        if (v != p->vDiv2Nod->nSize) {
          __assert_fail("Num == Vec_IntSize(p->vDiv2Nod)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                        ,0x2a4,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
        }
        uVar20 = (ulong)(uint)((int)uVar20 + iVar26);
        iVar6 = iVar6 + iVar24;
        Vec_IntPush(p->vDiv2Nod,p->vNodStore->nSize);
        Vec_IntPush(p->vNodStore,0);
        Vec_IntFillExtra(p->vNodStore,iVar26 + p->vNodStore->nSize,-1);
        *(int *)((long)__s + uVar27 * 4) = v;
        uVar21 = local_40;
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 != uVar21);
  }
  iVar26 = p->vHash->vObjs->nSize;
  iVar24 = iVar26 + 3;
  if (-1 < iVar26) {
    iVar24 = iVar26;
  }
  if (p->vCounts->nSize != iVar24 >> 2) {
    __assert_fail("Vec_FltSize(p->vCounts) == Hash_IntManEntryNum(p->vHash)+1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                  ,0x2ab,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
  }
  if (p->vDiv2Nod->nSize != iVar8 + 1) {
    __assert_fail("Vec_IntSize(p->vDiv2Nod) == nDivsUsed+1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                  ,0x2ac,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
  }
  if (pVVar17->pArray != (int *)0x0) {
    free(pVVar17->pArray);
  }
  free(pVVar17);
  pVVar17 = p_01->vTable;
  piVar11 = pVVar17->pArray;
  if (piVar11 != (int *)0x0) {
    free(piVar11);
  }
  free(pVVar17);
  free(p_01);
  if (local_c0 != (int *)0x0) {
    free(local_c0);
  }
  free(p_02);
  iVar26 = p_00->nSize;
  if (0 < (long)iVar26) {
    piVar11 = p_00->pArray;
    iVar24 = -1;
    lVar28 = 0;
    do {
      iVar10 = piVar11[lVar28];
      if ((long)iVar10 < 0) {
        iVar24 = -iVar10;
      }
      else {
        if ((int)uVar29 <= iVar10) goto LAB_0068548e;
        uVar7 = *(uint *)((long)__s + (long)iVar10 * 4);
        if ((ulong)uVar7 != 0xffffffff) {
          if ((int)uVar7 < 0) {
LAB_0068548e:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar10 = p->vDiv2Nod->pArray[uVar7];
          if (((long)iVar10 < 0) || (p->vNodStore->nSize <= iVar10)) {
LAB_006854ad:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          piVar2 = p->vNodStore->pArray + iVar10;
          iVar10 = *piVar2;
          *piVar2 = iVar10 + 1;
          piVar2[(long)iVar10 + 1] = iVar24;
        }
      }
      lVar28 = lVar28 + 1;
    } while (iVar26 != lVar28);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  pVVar17 = (Vec_Int_t *)malloc(0x10);
  pVVar17->nCap = uVar19;
  if (uVar19 == 0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)malloc(lVar23 << 2);
  }
  pVVar17->pArray = piVar11;
  pVVar17->nSize = uVar18;
  memset(piVar11,0,(long)(int)uVar18 << 2);
  p->vDivLevR = pVVar17;
  if (fVerbose != 0) {
    printf("Pairs:");
    iVar26 = 1;
    if (1 < iVar5) {
      iVar26 = iVar5;
    }
    dVar31 = (double)iVar26;
    printf("  Total =%9d (%6.2f %%)",((double)iVar5 * 100.0) / dVar31);
    printf("  Tried =%9d (%6.2f %%)",((double)local_a8 * 100.0) / dVar31);
    printf("  Used =%9d (%6.2f %%)",((double)(int)uVar20 * 100.0) / dVar31,uVar20);
    printf("  Xor =%9d (%6.2f %%)",((double)iVar6 * 100.0) / dVar31);
    putchar(10);
    printf("Div:  ");
    uVar7 = 1;
    if (1 < (int)uVar9) {
      uVar7 = uVar9;
    }
    dVar31 = (double)(int)uVar7;
    printf("  Total =%9d (%6.2f %%)",(ulong)uVar9);
    printf("  Tried =%9d (%6.2f %%)",((double)(int)uVar9 * 100.0) / dVar31,(ulong)uVar9);
    printf("  Used =%9d (%6.2f %%)",((double)iVar8 * 100.0) / dVar31);
    printf("  Xor =%9d (%6.2f %%)",((double)local_a4 * 100.0) / dVar31);
    putchar(10);
    return;
  }
  return;
}

Assistant:

void Dam_ManCreatePairs( Dam_Man_t * p, int fVerbose )
{
    Gia_Obj_t * pObj;
    Hash_IntMan_t * vHash;
    Vec_Int_t * vRefsAnd, * vRefsXor, * vSuper, * vDivs, * vRemap, * vLevRMax;
    int i, j, k, Num, FanK, FanJ, nRefs, iNode, iDiv, * pSet;
    int nPairsAll = 0, nPairsTried = 0, nPairsUsed = 0, nPairsXor = 0;
    int nDivsAll = 0, nDivsUsed = 0, nDivsXor = 0;
    Dam_ManCollectSets( p );
    vSuper = p->pGia->vSuper;
    vDivs  = Vec_IntAlloc( Gia_ManObjNum(p->pGia) );
    vHash  = Hash_IntManStart( Gia_ManObjNum(p->pGia)/2 );
    vLevRMax = Vec_IntStart( 1000 );
    Dam_ManCreateMultiRefs( p, &vRefsAnd, &vRefsXor );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( !Dam_ObjHand(p, i) )
            continue;
        pSet = Dam_ObjSet(p, i);
        nPairsAll += pSet[0] * (pSet[0] - 1) / 2;
        Vec_IntClear(vSuper);
        if ( Gia_ObjIsXor(pObj) )
        {
            for ( k = 1; k <= pSet[0]; k++ )
                if ( Vec_IntEntry(vRefsXor, Abc_Lit2Var(pSet[k])) > 1 )
                    Vec_IntPush( vSuper, pSet[k] );
        }
        else if ( Gia_ObjIsAndReal(p->pGia, pObj) )
        {
            for ( k = 1; k <= pSet[0]; k++ )
                if ( Vec_IntEntry(vRefsAnd, pSet[k]) > 1 )
                    Vec_IntPush( vSuper, pSet[k] );
        }
        else assert( 0 );
        if ( Vec_IntSize(vSuper) < 2 )
            continue;
        // enumerate pairs
        nPairsTried += Vec_IntSize(vSuper) * (Vec_IntSize(vSuper) - 1) / 2;
        Vec_IntPush( vDivs, -i ); // remember node
        Vec_IntForEachEntry( vSuper, FanK, k )
        Vec_IntForEachEntryStart( vSuper, FanJ, j, k+1 )
        {
            if ( (FanK > FanJ) ^ Gia_ObjIsXor(pObj) )
                Num = Hash_Int2ManInsert( vHash, FanJ, FanK, 0 );
            else
                Num = Hash_Int2ManInsert( vHash, FanK, FanJ, 0 );
            if ( Hash_Int2ObjInc( vHash, Num ) == 1 )
            {
                nDivsUsed++;
                nDivsXor += Gia_ObjIsXor(pObj);
            }
            Vec_IntPush( vDivs, Num ); // remember devisor
            // update reverse level
            if ( Num >= Vec_IntSize(vLevRMax) )
                Vec_IntFillExtra( vLevRMax, 3 * Vec_IntSize(vLevRMax) / 2, 0 );
            Vec_IntUpdateEntry( vLevRMax, Num, Vec_IntEntry(p->vNodLevR, i) );
        }
    }
    Vec_IntFree( vRefsAnd );
    Vec_IntFree( vRefsXor );
//    Hash_IntManProfile( vHash );
    // remove entries that appear only once
    p->vHash     = Hash_IntManStart( 3 * nDivsUsed /2 );
    p->vCounts   = Vec_FltAlloc( 2 * nDivsUsed );           Vec_FltPush( p->vCounts, ABC_INFINITY );
    p->vQue      = Vec_QueAlloc( Vec_FltCap(p->vCounts) );
    Vec_QueSetPriority( p->vQue, Vec_FltArrayP(p->vCounts) );
    // mapping div to node
    p->vDiv2Nod  = Vec_IntAlloc( 2 * nDivsUsed );           Vec_IntPush( p->vDiv2Nod, ABC_INFINITY );
    p->vNodStore = Vec_IntAlloc( Gia_ManObjNum(p->pGia) );  Vec_IntPush( p->vNodStore, -1 );
    nDivsAll     = Hash_IntManEntryNum(vHash);
    vRemap       = Vec_IntStartFull( nDivsAll+1 );
    for ( i = 1; i <= nDivsAll; i++ )
    {
        nRefs = Hash_IntObjData2(vHash, i);
        if ( nRefs < 2 )
            continue;
        nPairsUsed += nRefs;
        if ( Hash_IntObjData0(vHash, i) > Hash_IntObjData1(vHash, i) )
            nPairsXor += nRefs; 
        Num = Hash_Int2ManInsert( p->vHash, Hash_IntObjData0(vHash, i), Hash_IntObjData1(vHash, i), 0 );
        assert( Num == Hash_IntManEntryNum(p->vHash) );
        assert( Num == Vec_FltSize(p->vCounts) );
        Vec_FltPush( p->vCounts, nRefs + 0.005*Dam_ManDivSlack(p, Hash_IntObjData0(vHash, i), Hash_IntObjData1(vHash, i), Vec_IntEntry(vLevRMax, i)) );
        Vec_QuePush( p->vQue, Num );
        // remember divisors
        assert( Num == Vec_IntSize(p->vDiv2Nod) );
        Vec_IntPush( p->vDiv2Nod, Vec_IntSize(p->vNodStore) );
        Vec_IntPush( p->vNodStore, 0 );
        Vec_IntFillExtra( p->vNodStore, Vec_IntSize(p->vNodStore) + nRefs, -1 );
        // remember entry
        Vec_IntWriteEntry( vRemap, i, Num );
    }
    assert( Vec_FltSize(p->vCounts) == Hash_IntManEntryNum(p->vHash)+1 );
    assert( Vec_IntSize(p->vDiv2Nod) == nDivsUsed+1 );
    Hash_IntManStop( vHash );
    Vec_IntFree( vLevRMax );
    // fill in the divisors
    iNode = -1;
    Vec_IntForEachEntry( vDivs, iDiv, i )
    {
        if ( iDiv < 0 )
        {
            iNode = -iDiv;
            continue;
        }
        Num = Vec_IntEntry( vRemap, iDiv );
        if ( Num == -1 )
            continue;
        pSet = Dam_DivSet( p, Num );
        pSet[++pSet[0]] = iNode;
    }
    Vec_IntFree( vRemap );
    Vec_IntFree( vDivs );
    // create storage for reverse level of divisor during update
    p->vDivLevR = Vec_IntStart( 2 * nDivsUsed );
    // make sure divisors are added correctly
//    for ( i = 1; i <= nDivsUsed; i++ )
//        assert( Dam_DivSet(p, i)[0] == Vec_FltEntry(p->vCounts, i)+1 );
    if ( !fVerbose )
        return;
    // print stats
    printf( "Pairs:" );
    printf( "  Total =%9d (%6.2f %%)", nPairsAll,   100.0 * nPairsAll   / Abc_MaxInt(nPairsAll, 1) );
    printf( "  Tried =%9d (%6.2f %%)", nPairsTried, 100.0 * nPairsTried / Abc_MaxInt(nPairsAll, 1) );
    printf( "  Used =%9d (%6.2f %%)",  nPairsUsed,  100.0 * nPairsUsed  / Abc_MaxInt(nPairsAll, 1) );
    printf( "  Xor =%9d (%6.2f %%)",   nPairsXor,   100.0 * nPairsXor   / Abc_MaxInt(nPairsAll, 1) );
    printf( "\n" );
    printf( "Div:  " );
    printf( "  Total =%9d (%6.2f %%)", nDivsAll,    100.0 * nDivsAll    / Abc_MaxInt(nDivsAll, 1) );
    printf( "  Tried =%9d (%6.2f %%)", nDivsAll,    100.0 * nDivsAll    / Abc_MaxInt(nDivsAll, 1) );
    printf( "  Used =%9d (%6.2f %%)",  nDivsUsed,   100.0 * nDivsUsed   / Abc_MaxInt(nDivsAll, 1) );
    printf( "  Xor =%9d (%6.2f %%)",   nDivsXor,    100.0 * nDivsXor    / Abc_MaxInt(nDivsAll, 1) );
    printf( "\n" );
}